

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

HTTP_HEADERS_HANDLE HTTPHeaders_Alloc(void)

{
  LOGGER_LOG p_Var1;
  MAP_HANDLE pMVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTP_HEADERS_HANDLE_DATA *result;
  
  l = (LOGGER_LOG)malloc(8);
  if (l == (LOGGER_LOG)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpheaders.c"
                ,"HTTPHeaders_Alloc",0x1d,1,"malloc failed");
    }
  }
  else {
    pMVar2 = Map_Create((MAP_FILTER_CALLBACK)0x0);
    *(MAP_HANDLE *)l = pMVar2;
    if (*(long *)l == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpheaders.c"
                  ,"HTTPHeaders_Alloc",0x25,1,"Map_Create failed");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (HTTP_HEADERS_HANDLE)l;
}

Assistant:

HTTP_HEADERS_HANDLE HTTPHeaders_Alloc(void)
{
    /*Codes_SRS_HTTP_HEADERS_99_002:[ This API shall produce a HTTP_HANDLE that can later be used in subsequent calls to the module.]*/
    HTTP_HEADERS_HANDLE_DATA* result;
    result = (HTTP_HEADERS_HANDLE_DATA*)malloc(sizeof(HTTP_HEADERS_HANDLE_DATA));

    if (result == NULL)
    {
        LogError("malloc failed");
    }
    else
    {
        /*Codes_SRS_HTTP_HEADERS_99_004:[ After a successful init, HTTPHeaders_GetHeaderCount shall report 0 existing headers.]*/
        result->headers = Map_Create(NULL);
        if (result->headers == NULL)
        {
            LogError("Map_Create failed");
            free(result);
            result = NULL;
        }
        else
        {
            /*all is fine*/
        }
    }

    /*Codes_SRS_HTTP_HEADERS_99_003:[ The function shall return NULL when the function cannot execute properly]*/
    return (HTTP_HEADERS_HANDLE)result;
}